

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-interpreter.h
# Opt level: O0

Flow * __thiscall
wasm::ExpressionRunner<(anonymous_namespace)::EvallingModuleRunner>::visitSelect
          (Flow *__return_storage_ptr__,
          ExpressionRunner<(anonymous_namespace)::EvallingModuleRunner> *this,Select *curr)

{
  bool bVar1;
  int32_t iVar2;
  Literal *this_00;
  Flow *local_140;
  undefined1 local_108 [8];
  Flow condition;
  Flow ifFalse;
  undefined1 local_68 [8];
  Flow ifTrue;
  Select *curr_local;
  ExpressionRunner<(anonymous_namespace)::EvallingModuleRunner> *this_local;
  
  ifTrue.breakTo.super_IString.str._M_str = (char *)curr;
  visit((Flow *)local_68,this,*(Expression **)(curr + 0x10));
  bVar1 = Flow::breaking((Flow *)local_68);
  if (bVar1) {
    Flow::Flow(__return_storage_ptr__,(Flow *)local_68);
  }
  else {
    visit((Flow *)&condition.breakTo.super_IString.str._M_str,this,
          *(Expression **)(ifTrue.breakTo.super_IString.str._M_str + 0x18));
    bVar1 = Flow::breaking((Flow *)&condition.breakTo.super_IString.str._M_str);
    if (bVar1) {
      Flow::Flow(__return_storage_ptr__,(Flow *)&condition.breakTo.super_IString.str._M_str);
    }
    else {
      visit((Flow *)local_108,this,*(Expression **)(ifTrue.breakTo.super_IString.str._M_str + 0x20))
      ;
      bVar1 = Flow::breaking((Flow *)local_108);
      if (bVar1) {
        Flow::Flow(__return_storage_ptr__,(Flow *)local_108);
      }
      else {
        this_00 = Flow::getSingleValue((Flow *)local_108);
        iVar2 = wasm::Literal::geti32(this_00);
        if (iVar2 == 0) {
          local_140 = (Flow *)&condition.breakTo.super_IString.str._M_str;
        }
        else {
          local_140 = (Flow *)local_68;
        }
        Flow::Flow(__return_storage_ptr__,local_140);
      }
      Flow::~Flow((Flow *)local_108);
    }
    Flow::~Flow((Flow *)&condition.breakTo.super_IString.str._M_str);
  }
  Flow::~Flow((Flow *)local_68);
  return __return_storage_ptr__;
}

Assistant:

Flow visitSelect(Select* curr) {
    NOTE_ENTER("Select");
    Flow ifTrue = visit(curr->ifTrue);
    if (ifTrue.breaking()) {
      return ifTrue;
    }
    Flow ifFalse = visit(curr->ifFalse);
    if (ifFalse.breaking()) {
      return ifFalse;
    }
    Flow condition = visit(curr->condition);
    if (condition.breaking()) {
      return condition;
    }
    NOTE_EVAL1(condition.getSingleValue());
    return condition.getSingleValue().geti32() ? ifTrue : ifFalse; // ;-)
  }